

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnTable(SharedValidator *this,Location *loc,Type elem_type,Limits *limits)

{
  bool bVar1;
  size_type sVar2;
  TableType local_70;
  Enum local_4c;
  Enum local_48;
  Type local_44;
  Enum local_3c;
  Enum local_38;
  Enum local_34;
  Limits *local_30;
  Limits *limits_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type elem_type_local;
  Result result;
  
  local_30 = limits;
  limits_local = (Limits *)loc;
  loc_local = (Location *)this;
  unique0x10000266 = elem_type;
  Result::Result((Result *)&elem_type_local,Ok);
  sVar2 = std::
          vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>
          ::size(&this->tables_);
  if ((sVar2 != 0) && (bVar1 = Features::reference_types_enabled((Features *)this), !bVar1)) {
    local_34 = (Enum)PrintError(this,(Location *)limits_local,"only one table allowed");
    Result::operator|=((Result *)&elem_type_local,(Result)local_34);
  }
  local_38 = (Enum)CheckLimits(this,(Location *)limits_local,local_30,0xffffffff,"elems");
  Result::operator|=((Result *)&elem_type_local,(Result)local_38);
  if ((local_30->is_shared & 1U) != 0) {
    local_3c = (Enum)PrintError(this,(Location *)limits_local,"tables may not be shared");
    Result::operator|=((Result *)&elem_type_local,(Result)local_3c);
  }
  local_44 = stack0xffffffffffffffec;
  bVar1 = wabt::operator!=(stack0xffffffffffffffec,FuncRef);
  if ((bVar1) && (bVar1 = Features::reference_types_enabled((Features *)this), !bVar1)) {
    local_48 = (Enum)PrintError(this,(Location *)limits_local,"tables must have funcref type");
    Result::operator|=((Result *)&elem_type_local,(Result)local_48);
  }
  bVar1 = Type::IsRef((Type *)((long)&this_local + 4));
  if (!bVar1) {
    local_4c = (Enum)PrintError(this,(Location *)limits_local,"tables must have reference types");
    Result::operator|=((Result *)&elem_type_local,(Result)local_4c);
  }
  TableType::TableType(&local_70,stack0xffffffffffffffec,*local_30);
  std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>::
  push_back(&this->tables_,&local_70);
  return (Result)elem_type_local.enum_;
}

Assistant:

Result SharedValidator::OnTable(const Location& loc,
                                Type elem_type,
                                const Limits& limits) {
  Result result = Result::Ok;
  if (tables_.size() > 0 && !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "only one table allowed");
  }
  result |= CheckLimits(loc, limits, UINT32_MAX, "elems");

  if (limits.is_shared) {
    result |= PrintError(loc, "tables may not be shared");
  }
  if (elem_type != Type::FuncRef &&
      !options_.features.reference_types_enabled()) {
    result |= PrintError(loc, "tables must have funcref type");
  }
  if (!elem_type.IsRef()) {
    result |= PrintError(loc, "tables must have reference types");
  }

  tables_.push_back(TableType{elem_type, limits});
  return result;
}